

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

float Assimp::FBX::PropertyGet<float>(PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  PropertyTable *this;
  Property *this_00;
  TypedProperty<float> *pTVar1;
  
  this_00 = PropertyTable::Get(in,name);
  if (((this_00 != (Property *)0x0) ||
      (((useTemplate &&
        (this = (in->templateProps).
                super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, this != (PropertyTable *)0x0)) &&
       (this_00 = PropertyTable::Get(this,name), this_00 != (Property *)0x0)))) &&
     (pTVar1 = Property::As<Assimp::FBX::TypedProperty<float>>(this_00),
     pTVar1 != (TypedProperty<float> *)0x0)) {
    *result = true;
    return pTVar1->value;
  }
  *result = false;
  return 0.0;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}